

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall
CLIntercept::dumpBuffer
          (CLIntercept *this,string *name,uint64_t enqueueCounter,cl_mem memobj,
          cl_command_queue command_queue,void *ptr,size_t offset,size_t size)

{
  _Rb_tree_header *p_Var1;
  size_t size_00;
  int iVar2;
  long lVar3;
  mapped_type *pmVar4;
  mapped_type_conflict *pmVar5;
  void *ptr_00;
  undefined8 uVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  pthread_mutex_t *__mutex;
  string fileName;
  char bufferName [256];
  allocator local_189;
  cl_mem local_188;
  string local_180;
  pthread_mutex_t *local_160;
  cl_command_queue local_158;
  void *local_150;
  uint64_t local_148;
  string *local_140;
  undefined1 local_138 [264];
  
  __mutex = (pthread_mutex_t *)&this->m_Mutex;
  local_188 = memobj;
  local_158 = command_queue;
  local_148 = enqueueCounter;
  local_140 = name;
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 == 0) {
    p_Var1 = &(this->m_BufferInfoMap)._M_t._M_impl.super__Rb_tree_header;
    p_Var8 = (this->m_BufferInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var7 = &p_Var1->_M_header;
    for (; p_Var8 != (_Base_ptr)0x0;
        p_Var8 = (&p_Var8->_M_left)[*(cl_mem *)(p_Var8 + 1) < local_188]) {
      if (*(cl_mem *)(p_Var8 + 1) >= local_188) {
        p_Var7 = p_Var8;
      }
    }
    p_Var8 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
       (p_Var8 = p_Var7, local_188 < *(cl_mem *)(p_Var7 + 1))) {
      p_Var8 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var8 != p_Var1) {
      local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      local_160 = __mutex;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"");
      std::__cxx11::string::string((string *)local_138,sc_DumpDirectoryName,&local_189);
      OS::Services_Common::GetDumpDirectoryName
                (&(this->m_OS).super_Services_Common,(string *)local_138,&local_180);
      local_150 = ptr;
      if ((cl_mem)local_138._0_8_ != (cl_mem)(local_138 + 0x10)) {
        operator_delete((void *)local_138._0_8_);
      }
      std::__cxx11::string::append((char *)&local_180);
      lVar3 = std::__cxx11::string::find((char *)&local_180,0x19e01b,0);
      lVar3 = std::__cxx11::string::find((char *)&local_180,0x19e01b,lVar3 + 1);
      if (lVar3 != -1) {
        do {
          std::__cxx11::string::substr((ulong)local_138,(ulong)&local_180);
          mkdir((char *)local_138._0_8_,0x1ff);
          if ((cl_mem)local_138._0_8_ != (cl_mem)(local_138 + 0x10)) {
            operator_delete((void *)local_138._0_8_);
          }
          lVar3 = std::__cxx11::string::find((char *)&local_180,0x19e01b,lVar3 + 1);
        } while (lVar3 != -1);
      }
      __mutex = local_160;
      std::__cxx11::string::_M_append((char *)&local_180,(ulong)(local_140->_M_dataplus)._M_p);
      local_138._0_8_ = local_188;
      pmVar4 = std::
               map<const_void_*,_unsigned_int,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_int>_>_>
               ::operator[](&this->m_MemAllocNumberMap,(key_type *)local_138);
      snprintf(local_138,0x100,"%04u",(ulong)*pmVar4);
      std::__cxx11::string::append((char *)&local_180);
      std::__cxx11::string::append((char *)&local_180);
      snprintf(local_138,0x100,"%04zu",offset);
      std::__cxx11::string::append((char *)&local_180);
      std::__cxx11::string::append((char *)&local_180);
      snprintf(local_138,0x100,"%04u",local_148);
      std::__cxx11::string::append((char *)&local_180);
      std::__cxx11::string::append((char *)&local_180);
      std::__cxx11::string::append((char *)&local_180);
      if (size == 0 || local_150 == (void *)0x0) {
        pmVar5 = std::
                 map<_cl_mem_*,_unsigned_long,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_unsigned_long>_>_>
                 ::operator[](&this->m_BufferInfoMap,&local_188);
        size_00 = *pmVar5;
        local_138._0_8_ = local_138._0_8_ & 0xffffffff00000000;
        ptr_00 = (*(this->m_Dispatch).clEnqueueMapBuffer)
                           (local_158,local_188,1,1,0,size_00,0,(cl_event *)0x0,(cl_event *)0x0,
                            (cl_int *)local_138);
        __mutex = local_160;
        if (local_138._0_4_ == 0) {
          dumpMemoryToFile(this,&local_180,(this->m_Config).DumpBufferHashes,ptr_00,size_00);
          (*(this->m_Dispatch).clEnqueueUnmapMemObject)
                    (local_158,local_188,ptr_00,0,(cl_event *)0x0,(cl_event *)0x0);
          __mutex = local_160;
        }
      }
      else {
        dumpMemoryToFile(this,&local_180,(this->m_Config).DumpBufferHashes,local_150,size);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p);
      }
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  uVar6 = std::__throw_system_error(iVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  pthread_mutex_unlock(local_160);
  _Unwind_Resume(uVar6);
}

Assistant:

void CLIntercept::dumpBuffer(
    const std::string& name,
    const uint64_t enqueueCounter,
    cl_mem memobj,
    cl_command_queue command_queue,
    void* ptr,
    size_t offset,
    size_t size )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    if( m_BufferInfoMap.find( memobj ) != m_BufferInfoMap.end() )
    {
        std::string fileName = "";

        // Get the dump directory name.
        {
            OS().GetDumpDirectoryName( sc_DumpDirectoryName, fileName );
            fileName += "/memDumpCreateMapUnmap/";
        }

        // Now make directories as appropriate.
        {
            OS().MakeDumpDirectories( fileName );
        }

        fileName += name;

        // Add the buffer number to the file name
        {
            unsigned int        number = m_MemAllocNumberMap[ memobj ];

            char    bufferName[ MAX_PATH ];

            CLI_SPRINTF( bufferName, MAX_PATH, "%04u", number );

            fileName += "_Buffer_";
            fileName += bufferName;
        }

        // Add the offset to the file name
        {
            char    offsetName[ MAX_PATH ];

            CLI_SPRINTF( offsetName, MAX_PATH, "%04zu",
                offset );

            fileName += "_Offset_";
            fileName += offsetName;
        }

        // Add the enqueue count to file name
        {
            char    enqueueCount[ MAX_PATH ];

            CLI_SPRINTF( enqueueCount, MAX_PATH, "%04u",
                (unsigned int)enqueueCounter );

            fileName += "_Enqueue_";
            fileName += enqueueCount;
        }

        // Add extension to file name
        {
            fileName += ".bin";
        }

        // Dump the buffer contents to the file.
        // There are two possibilities:
        // 1) We have a pointer and size already.  This might happen
        //    when the buffer is being created or was just mapped.
        //    In this case, we can just write this to the file.
        // 2) We have no pointer or size.  This usually happens when
        //    the buffer is being unmapped.  In this case, we'll
        //    map and dump the entire buffer.
        if( ptr != NULL && size != 0 )
        {
            dumpMemoryToFile(
                fileName,
                config().DumpBufferHashes,
                ptr,
                size );
        }
        else
        {
            // We should have checked this already...
            CLI_ASSERT( m_BufferInfoMap.find( memobj ) != m_BufferInfoMap.end() );

            size_t  size = m_BufferInfoMap[ memobj ];

            cl_int  error = CL_SUCCESS;
            ptr = dispatch().clEnqueueMapBuffer(
                command_queue,
                memobj,
                CL_TRUE,
                CL_MAP_READ,
                0,
                size,
                0,
                NULL,
                NULL,
                &error );
            if( error == CL_SUCCESS )
            {
                dumpMemoryToFile(
                    fileName,
                    config().DumpBufferHashes,
                    ptr,
                    size );

                dispatch().clEnqueueUnmapMemObject(
                    command_queue,
                    memobj,
                    ptr,
                    0,
                    NULL,
                    NULL );
            }
        }
    }
}